

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

bool __thiscall
cmArgumentParser<(anonymous_namespace)::OutputVariable>::
Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          (cmArgumentParser<(anonymous_namespace)::OutputVariable> *this,OutputVariable *result,
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unparsedArguments,size_t pos)

{
  bool local_c1;
  undefined1 local_a0 [8];
  Instance instance;
  ParseResult *parseResultPtr;
  size_t pos_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unparsedArguments_local;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *args_local;
  OutputVariable *result_local;
  cmArgumentParser<(anonymous_namespace)::OutputVariable> *this_local;
  
  instance._96_8_ = ArgumentParser::AsParseResultPtr<(anonymous_namespace)::OutputVariable>(result);
  ArgumentParser::Instance::Instance
            ((Instance *)local_a0,(ActionMap *)this,(ParseResult *)instance._96_8_,unparsedArguments
             ,result);
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_a0,args,pos);
  if (instance._96_8_ == 0) {
    local_c1 = true;
  }
  else {
    local_c1 = ArgumentParser::ParseResult::operator_cast_to_bool((ParseResult *)instance._96_8_);
  }
  ArgumentParser::Instance::~Instance((Instance *)local_a0);
  return local_c1;
}

Assistant:

bool Parse(Result& result, Range const& args,
             std::vector<std::string>* unparsedArguments,
             std::size_t pos = 0) const
  {
    using ArgumentParser::AsParseResultPtr;
    ParseResult* parseResultPtr = AsParseResultPtr(result);
    Instance instance(this->Bindings, parseResultPtr, unparsedArguments,
                      &result);
    instance.Parse(args, pos);
    return parseResultPtr ? static_cast<bool>(*parseResultPtr) : true;
  }